

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall
CTcTokFileDesc::enum_source_lines
          (CTcTokFileDesc *this,_func_void_void_ptr_ulong_ulong *cbfunc,void *cbctx)

{
  CTcTokSrcPage *pCVar1;
  ulong uVar2;
  CTcTokSrcPage **ppCVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  ppCVar3 = this->src_pages_;
  lVar6 = 0;
  for (uVar4 = 0; uVar4 < this->src_pages_alo_; uVar4 = uVar4 + 1) {
    pCVar1 = *ppCVar3;
    if (pCVar1 != (CTcTokSrcPage *)0x0) {
      for (lVar5 = 0; lVar5 != 0x400; lVar5 = lVar5 + 1) {
        uVar2 = pCVar1->ofs[lVar5];
        if (uVar2 != 0) {
          (*cbfunc)(cbctx,lVar5 + lVar6,uVar2);
        }
      }
    }
    ppCVar3 = ppCVar3 + 1;
    lVar6 = lVar6 + 0x400;
  }
  return;
}

Assistant:

void CTcTokFileDesc::enum_source_lines(void (*cbfunc)(void *, ulong, ulong),
                                       void *cbctx)
{
    size_t page_idx;
    CTcTokSrcPage **pg;

    /* loop over all of the pages */
    for (page_idx = 0, pg = src_pages_ ; page_idx < src_pages_alo_ ;
         ++page_idx, ++pg)
    {
        size_t i;
        ulong linenum;
        ulong *p;

        /* if this page is not populated, skip it */
        if (*pg == 0)
            continue;

        /* calculate the starting line number for this page */
        linenum = page_idx * TCTOK_SRC_PAGE_CNT;
        
        /* loop over the entries on this page */
        for (i = 0, p = (*pg)->ofs ; i < TCTOK_SRC_PAGE_CNT ;
             ++i, ++p, ++linenum)
        {
            /* if this entry has been set, call the callback */
            if (*p != 0)
                (*cbfunc)(cbctx, linenum, *p);
        }
    }
}